

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeWriter.cpp
# Opt level: O3

void __thiscall
Js::ByteCodeWriter::Element
          (ByteCodeWriter *this,OpCode op,RegSlot Value,RegSlot Instance,RegSlot Element,
          bool instanceAtReturnRegOK,bool forceStrictMode)

{
  Type TVar1;
  code *pcVar2;
  uint uVar3;
  RegSlot Value_00;
  bool bVar4;
  RegSlot RVar5;
  RegSlot Instance_00;
  int iVar6;
  undefined4 *puVar7;
  undefined7 extraout_var;
  FunctionBody *pFVar8;
  undefined6 in_register_00000032;
  undefined3 in_register_00000089;
  OpCode op_00;
  ulong uVar9;
  RegSlot local_50;
  RegSlot local_4c;
  RegSlot local_48;
  RegSlot local_44;
  uint local_40;
  undefined4 local_3c;
  Type local_36;
  undefined4 local_34;
  ProfileId profileId;
  
  local_34 = CONCAT31(in_register_00000089,instanceAtReturnRegOK);
  CheckOpen(this);
  CheckOp(this,op,(OpLayoutType)0x2f);
  local_40 = (uint)CONCAT62(in_register_00000032,op);
  bVar4 = OpCodeAttr::HasMultiSizeLayout(op);
  if (!bVar4) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar7 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                ,0x556,"(OpCodeAttr::HasMultiSizeLayout(op))",
                                "OpCodeAttr::HasMultiSizeLayout(op)");
    if (!bVar4) goto LAB_00890894;
    *puVar7 = 0;
  }
  if (Value != 0xffffffff) {
    pFVar8 = this->m_functionWrite;
    if (pFVar8 == (FunctionBody *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar7 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                  ,0x12a,"(this->m_functionWrite)","this->m_functionWrite");
      if (!bVar4) goto LAB_00890894;
      *puVar7 = 0;
      pFVar8 = this->m_functionWrite;
    }
    RVar5 = FunctionBody::MapRegSlot(pFVar8,Value);
    if (Instance != 0xffffffff) {
      pFVar8 = this->m_functionWrite;
      if (pFVar8 == (FunctionBody *)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar7 = 1;
        bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                    ,0x12a,"(this->m_functionWrite)","this->m_functionWrite");
        if (!bVar4) goto LAB_00890894;
        *puVar7 = 0;
        pFVar8 = this->m_functionWrite;
      }
      Instance_00 = FunctionBody::MapRegSlot(pFVar8,Instance);
      if (Element != 0xffffffff) {
        pFVar8 = this->m_functionWrite;
        if (pFVar8 == (FunctionBody *)0x0) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
          *puVar7 = 1;
          bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                      ,0x12a,"(this->m_functionWrite)","this->m_functionWrite");
          if (!bVar4) goto LAB_00890894;
          *puVar7 = 0;
          pFVar8 = this->m_functionWrite;
        }
        local_44 = RVar5;
        RVar5 = FunctionBody::MapRegSlot(pFVar8,Element);
        pFVar8 = this->m_functionWrite;
        uVar3 = local_40 & 0xffff;
        if (forceStrictMode) {
          uVar3 = 0xa5;
        }
        uVar9 = (ulong)uVar3;
        if ((*(ushort *)&(pFVar8->super_ParseableFunctionInfo).super_FunctionProxy.field_0x45 &
            0x100) != 0) {
          uVar9 = 0xa5;
        }
        if ((local_40 & 0xffff) != 0xa4) {
          uVar9 = (ulong)(ushort)local_40;
        }
        op_00 = (OpCode)uVar9;
        local_36 = 0xffff;
        if (Instance_00 == 0 && (char)local_34 == '\0') {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
          *puVar7 = 1;
          bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                      ,0x566,"(instanceAtReturnRegOK || Instance != 0)",
                                      "instanceAtReturnRegOK || Instance != 0");
          if (!bVar4) goto LAB_00890894;
          *puVar7 = 0;
          pFVar8 = this->m_functionWrite;
        }
        bVar4 = DynamicProfileInfo::IsEnabled(AggressiveIntTypeSpecPhase,pFVar8);
        if (!bVar4) {
          bVar4 = DynamicProfileInfo::IsEnabled(FloatTypeSpecPhase,this->m_functionWrite);
          if (bVar4) goto LAB_00890692;
          bVar4 = DynamicProfileInfo::IsEnabled(TypedArrayTypeSpecPhase,this->m_functionWrite);
          if (bVar4) goto LAB_00890692;
          bVar4 = DynamicProfileInfo::IsEnabled(ArrayCheckHoistPhase,this->m_functionWrite);
          if (bVar4) goto LAB_00890692;
          local_3c = (undefined4)CONCAT71(extraout_var,1);
          goto LAB_00890746;
        }
LAB_00890692:
        iVar6 = (int)uVar9;
        if (iVar6 == 0x9c) {
          op_00 = ProfiledStElemI_A_Strict;
LAB_008906e3:
          pFVar8 = this->m_functionWrite;
          TVar1 = pFVar8->profiledStElemCount;
          if (TVar1 == 0xffff) {
            local_3c = (undefined4)CONCAT71((int7)((ulong)pFVar8 >> 8),1);
            local_34 = 0;
            op_00 = (OpCode)local_40;
          }
          else {
            pFVar8->profiledStElemCount = TVar1 + 1;
            local_36 = TVar1;
LAB_00890705:
            local_34 = (undefined4)CONCAT71((int7)((ulong)pFVar8 >> 8),1);
            local_3c = 0;
          }
        }
        else {
          if (iVar6 == 0x9a) {
            op_00 = ProfiledStElemI_A;
            goto LAB_008906e3;
          }
          if (iVar6 == 0x97) {
            pFVar8 = this->m_functionWrite;
            TVar1 = pFVar8->profiledLdElemCount;
            if (TVar1 == 0xffff) {
              local_3c = (undefined4)CONCAT71((int7)((ulong)pFVar8 >> 8),1);
              op_00 = LdElemI_A;
              goto LAB_00890746;
            }
            pFVar8->profiledLdElemCount = TVar1 + 1;
            op_00 = ProfiledLdElemI_A;
            local_36 = TVar1;
            goto LAB_00890705;
          }
          local_3c = (undefined4)CONCAT71((int7)(uVar9 >> 8),1);
LAB_00890746:
          local_34 = 0;
        }
        Value_00 = local_44;
        bVar4 = TryWriteElementI<Js::LayoutSizePolicy<(Js::LayoutSize)0>>
                          (this,op_00,local_44,Instance_00,RVar5);
        if (!bVar4) {
          bVar4 = TryWriteElementI<Js::LayoutSizePolicy<(Js::LayoutSize)1>>
                            (this,op_00,Value_00,Instance_00,RVar5);
          if (!bVar4) {
            local_50 = Value_00;
            local_4c = Instance_00;
            local_48 = RVar5;
            Data::EncodeT<(Js::LayoutSize)2>(&this->m_byteCodeData,op_00,this);
            Data::Write(&this->m_byteCodeData,&local_50,0xc);
          }
        }
        if ((char)local_34 != '\0') {
          if ((char)local_3c != '\0') {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
            *puVar7 = 1;
            bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                        ,0x58b,"(profileId != Js::Constants::NoProfileId)",
                                        "profileId != Js::Constants::NoProfileId");
            if (!bVar4) goto LAB_00890894;
            *puVar7 = 0;
          }
          Data::Write(&this->m_byteCodeData,&local_36,2);
        }
        return;
      }
    }
  }
  AssertCount = AssertCount + 1;
  Throw::LogAssert();
  puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
  *puVar7 = 1;
  bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                              ,0x146,"(registerID != Js::Constants::NoRegister)","bad register");
  if (bVar4) {
    *puVar7 = 0;
    Throw::InternalError();
  }
LAB_00890894:
  pcVar2 = (code *)invalidInstructionException();
  (*pcVar2)();
}

Assistant:

void ByteCodeWriter::Element(OpCode op, RegSlot Value, RegSlot Instance, RegSlot Element, bool instanceAtReturnRegOK, bool forceStrictMode)
    {
        CheckOpen();
        CheckOp(op, OpLayoutType::ElementI);
        Assert(OpCodeAttr::HasMultiSizeLayout(op));

        Value = ConsumeReg(Value);
        Instance = ConsumeReg(Instance);
        Element = ConsumeReg(Element);

        if (this->m_functionWrite->GetIsStrictMode() || forceStrictMode)
        {
            if (op == OpCode::DeleteElemI_A)
            {
                op = OpCode::DeleteElemIStrict_A;
            }
        }

        bool isProfiledLayout = false;
        Js::ProfileId profileId = Js::Constants::NoProfileId;
        Assert(instanceAtReturnRegOK || Instance != 0);
        if (DoDynamicProfileOpcode(AggressiveIntTypeSpecPhase) ||
            DoDynamicProfileOpcode(FloatTypeSpecPhase) ||
            DoDynamicProfileOpcode(TypedArrayTypeSpecPhase) ||
            DoDynamicProfileOpcode(ArrayCheckHoistPhase))
        {
            OpCode newop;
            switch (op)
            {
            case OpCode::LdElemI_A:
                newop = OpCode::ProfiledLdElemI_A;
                if (this->m_functionWrite->AllocProfiledLdElemId(&profileId))
                {
                    isProfiledLayout = true;
                    op = newop;
                }
                break;

            case Js::OpCode::StElemI_A:
                newop = OpCode::ProfiledStElemI_A;
                goto StoreCommon;

            case Js::OpCode::StElemI_A_Strict:
                newop = OpCode::ProfiledStElemI_A_Strict;
StoreCommon:
                if (this->m_functionWrite->AllocProfiledStElemId(&profileId))
                {
                    isProfiledLayout = true;
                    op = newop;
                }
                break;
            }
        }

        MULTISIZE_LAYOUT_WRITE(ElementI, op, Value, Instance, Element);
        if (isProfiledLayout)
        {
            Assert(profileId != Js::Constants::NoProfileId);
            m_byteCodeData.Encode(&profileId, sizeof(Js::ProfileId));
        }
    }